

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int vdbeMergeEngineInit(SortSubtask *pTask,MergeEngine *pMerger,int eMode)

{
  PmaReader *pPVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  long in_FS_OFFSET;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pMerger->pTask = pTask;
  uVar6 = pMerger->nTree;
  lVar10 = 0;
  uVar5 = 0;
  if (0 < (int)uVar6) {
    uVar5 = (ulong)uVar6;
  }
  while (uVar6 = uVar6 - 1, uVar5 * 0x50 - lVar10 != 0) {
    if (eMode == 2) {
      uVar2 = vdbePmaReaderNext(pMerger->aReadr + (int)uVar6);
    }
    else {
      uVar2 = vdbePmaReaderIncrInit((PmaReader *)((long)&pMerger->aReadr->iReadOff + lVar10),0);
    }
    lVar10 = lVar10 + 0x50;
    if (uVar2 != 0) goto LAB_00151ee5;
  }
  iVar8 = pMerger->nTree;
  uVar5 = (ulong)(iVar8 - 1);
  uVar6 = iVar8 * 2;
  while( true ) {
    uVar2 = uVar6 - 2;
    if (iVar8 < 2) break;
    iVar3 = pMerger->nTree / 2;
    if (iVar3 < iVar8) {
      iVar7 = uVar2 + iVar3 * -2;
      iVar3 = iVar7 + 1;
    }
    else {
      iVar7 = pMerger->aTree[uVar2];
      iVar3 = pMerger->aTree[uVar6 - 1];
    }
    pPVar1 = pMerger->aReadr;
    iVar9 = iVar3;
    if ((pPVar1[iVar7].pFd != (sqlite3_file *)0x0) &&
       (iVar9 = iVar7, pPVar1[iVar3].pFd != (sqlite3_file *)0x0)) {
      local_3c = 0;
      iVar4 = (*pMerger->pTask->xCompare)
                        (pMerger->pTask,&local_3c,pPVar1[iVar7].aKey,pPVar1[iVar7].nKey,
                         pPVar1[iVar3].aKey,pPVar1[iVar3].nKey);
      iVar9 = iVar3;
      if (iVar4 < 1) {
        iVar9 = iVar7;
      }
    }
    pMerger->aTree[uVar5] = iVar9;
    iVar8 = iVar8 + -1;
    uVar5 = uVar5 - 1;
    uVar6 = uVar2;
  }
  uVar2 = (uint)pTask->pUnpacked->errCode;
LAB_00151ee5:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return uVar2;
}

Assistant:

static int vdbeMergeEngineInit(
  SortSubtask *pTask,             /* Thread that will run pMerger */
  MergeEngine *pMerger,           /* MergeEngine to initialize */
  int eMode                       /* One of the INCRINIT_XXX constants */
){
  int rc = SQLITE_OK;             /* Return code */
  int i;                          /* For looping over PmaReader objects */
  int nTree;                      /* Number of subtrees to merge */

  /* Failure to allocate the merge would have been detected prior to
  ** invoking this routine */
  assert( pMerger!=0 );

  /* eMode is always INCRINIT_NORMAL in single-threaded mode */
  assert( SQLITE_MAX_WORKER_THREADS>0 || eMode==INCRINIT_NORMAL );

  /* Verify that the MergeEngine is assigned to a single thread */
  assert( pMerger->pTask==0 );
  pMerger->pTask = pTask;

  nTree = pMerger->nTree;
  for(i=0; i<nTree; i++){
    if( SQLITE_MAX_WORKER_THREADS>0 && eMode==INCRINIT_ROOT ){
      /* PmaReaders should be normally initialized in order, as if they are
      ** reading from the same temp file this makes for more linear file IO.
      ** However, in the INCRINIT_ROOT case, if PmaReader aReadr[nTask-1] is
      ** in use it will block the vdbePmaReaderNext() call while it uses
      ** the main thread to fill its buffer. So calling PmaReaderNext()
      ** on this PmaReader before any of the multi-threaded PmaReaders takes
      ** better advantage of multi-processor hardware. */
      rc = vdbePmaReaderNext(&pMerger->aReadr[nTree-i-1]);
    }else{
      rc = vdbePmaReaderIncrInit(&pMerger->aReadr[i], INCRINIT_NORMAL);
    }
    if( rc!=SQLITE_OK ) return rc;
  }

  for(i=pMerger->nTree-1; i>0; i--){
    vdbeMergeEngineCompare(pMerger, i);
  }
  return pTask->pUnpacked->errCode;
}